

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

TemplateDictionary * __thiscall
ctemplate::TemplateDictionary::InternalMakeCopy
          (TemplateDictionary *this,TemplateString *name_of_copy,UnsafeArena *arena,
          TemplateDictionary *parent_dict,TemplateDictionary *template_global_dict_owner)

{
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *this_00;
  bool bVar1;
  TemplateDictionary *this_01;
  VariableDict *pVVar2;
  TemplateDictionary *pTVar3;
  SectionDict *pSVar4;
  vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
  *pvVar5;
  IncludeDict *pIVar6;
  uint uVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  iterator it_1;
  undefined1 local_88 [32];
  value_type local_68;
  const_iterator it;
  
  if (this->template_global_dict_owner_ == this) {
    this_01 = (TemplateDictionary *)operator_new(0x70);
    TemplateDictionary(this_01,name_of_copy,arena);
  }
  else {
    if (arena == (UnsafeArena *)0x0) {
      __assert_fail("arena",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                    ,0x11f,
                    "TemplateDictionary *ctemplate::TemplateDictionary::InternalMakeCopy(const TemplateString &, UnsafeArena *, TemplateDictionary *, TemplateDictionary *)"
                   );
    }
    if ((parent_dict != (TemplateDictionary *)0x0) && (parent_dict->arena_ != arena)) {
      __assert_fail("parent_dict ? arena == parent_dict->arena_ : true",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                    ,0x120,
                    "TemplateDictionary *ctemplate::TemplateDictionary::InternalMakeCopy(const TemplateString &, UnsafeArena *, TemplateDictionary *, TemplateDictionary *)"
                   );
    }
    this_01 = CreateTemplateSubdict(this,name_of_copy,arena,parent_dict,template_global_dict_owner);
  }
  if (this->variable_dict_ != (VariableDict *)0x0) {
    LazilyCreateDict<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>>
              (this_01,&this_01->variable_dict_);
    pVVar2 = this->variable_dict_;
    uVar7 = pVVar2->size_;
    it.hash_iter_._M_node = (_Base_ptr)0x0;
    if ((int)uVar7 < 0) {
      it.hash_iter_._M_node = *(_Base_ptr *)((long)&pVVar2->field_2 + 0x20);
      it.array_iter_ =
           (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)0x0;
    }
    else {
      it.array_iter_ =
           (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
           &pVVar2->field_2;
    }
    while( true ) {
      local_68.second.ptr_ = (char *)((long)&pVVar2->field_2 + 0x10);
      local_68.first =
           (unsigned_long)
           (vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
            *)0x0;
      if (-1 < (int)uVar7) {
        local_68.second.ptr_ =
             (char *)(vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
                      *)0x0;
        local_68.first = (unsigned_long)((long)&pVVar2->field_2 + (ulong)uVar7 * 0x28);
      }
      bVar1 = small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
              ::const_iterator::operator!=(&it,(const_iterator *)&local_68);
      if (!bVar1) break;
      this_00 = this_01->variable_dict_;
      p_Var8 = it.hash_iter_._M_node + 1;
      if (it.array_iter_ !=
          (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)0x0) {
        p_Var8 = (_Base_ptr)it.array_iter_;
      }
      Memdup((TemplateString *)local_88,this_01,(TemplateString *)&p_Var8->_M_parent);
      local_68.first = *(unsigned_long *)p_Var8;
      local_68.second._16_8_ = local_88._16_8_;
      local_68.second.id_ = local_88._24_8_;
      local_68.second.ptr_ = (char *)local_88._0_8_;
      local_68.second.length_ = local_88._8_8_;
      small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
      ::insert((pair<ctemplate::small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>::iterator,_bool>
                *)&it_1,this_00,&local_68);
      small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
      ::const_iterator::operator++(&it);
      pVVar2 = this->variable_dict_;
      uVar7 = pVVar2->size_;
    }
  }
  pTVar3 = this->template_global_dict_;
  if (pTVar3 != (TemplateDictionary *)0x0) {
    name_abi_cxx11_((string *)local_88,pTVar3);
    local_68.first = local_88._0_8_;
    local_68.second.ptr_ = (char *)local_88._8_8_;
    local_68.second.length_ = local_68.second.length_ & 0xffffffffffffff00;
    local_68.second._16_8_ = 0;
    pTVar3 = InternalMakeCopy(pTVar3,(TemplateString *)&local_68,this_01->arena_,this_01,
                              this_01->template_global_dict_owner_);
    this_01->template_global_dict_ = pTVar3;
    std::__cxx11::string::~string((string *)local_88);
  }
  if (this->section_dict_ != (SectionDict *)0x0) {
    LazilyCreateDict<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>>
              (this_01,&this_01->section_dict_);
    pSVar4 = this->section_dict_;
    uVar7 = pSVar4->size_;
    it_1.hash_iter_._M_node = (_Base_ptr)0x0;
    if ((int)uVar7 < 0) {
      it_1.hash_iter_._M_node = *(_Base_ptr *)((long)&pSVar4->field_2 + 0x20);
      it_1.array_iter_ =
           (ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
            *)0x0;
    }
    else {
      it_1.array_iter_ =
           (ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
            *)&pSVar4->field_2;
    }
    while( true ) {
      local_68.second.ptr_ = (char *)((long)&pSVar4->field_2 + 0x10);
      local_68.first = (long)&pSVar4->field_2 + (ulong)uVar7 * 0x10;
      if ((int)uVar7 < 0) {
        local_68.first = 0;
      }
      else {
        local_68.second.ptr_ = (char *)0x0;
      }
      bVar1 = small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
              ::iterator::operator!=(&it_1,(iterator *)&local_68);
      if (!bVar1) break;
      pvVar5 = (vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
                *)CreateDictVector(this_01);
      p_Var8 = it_1.hash_iter_._M_node + 1;
      if (it_1.array_iter_ !=
          (ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
           *)0x0) {
        p_Var8 = (_Base_ptr)it_1.array_iter_;
      }
      local_88._0_8_ = *(undefined8 *)p_Var8;
      local_88._8_8_ = pvVar5;
      small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
      ::insert((pair<ctemplate::small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>::iterator,_bool>
                *)&local_68,this_01->section_dict_,(value_type *)local_88);
      p_Var8 = it_1.hash_iter_._M_node + 1;
      if (it_1.array_iter_ !=
          (ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
           *)0x0) {
        p_Var8 = (_Base_ptr)it_1.array_iter_;
      }
      p_Var9 = p_Var8->_M_parent->_M_parent;
      while( true ) {
        p_Var8 = it_1.hash_iter_._M_node + 1;
        if (it_1.array_iter_ !=
            (ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
             *)0x0) {
          p_Var8 = (_Base_ptr)it_1.array_iter_;
        }
        if (p_Var9 == p_Var8->_M_parent->_M_left) break;
        pTVar3 = *(TemplateDictionary **)p_Var9;
        name_abi_cxx11_((string *)local_88,pTVar3);
        local_68.first = local_88._0_8_;
        local_68.second.ptr_ = (char *)local_88._8_8_;
        local_68.second.length_ = local_68.second.length_ & 0xffffffffffffff00;
        local_68.second._16_8_ = 0;
        it.array_iter_ =
             (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
             InternalMakeCopy(pTVar3,(TemplateString *)&local_68,this_01->arena_,this_01,
                              this_01->template_global_dict_owner_);
        std::
        vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
        ::emplace_back<ctemplate::TemplateDictionary*>(pvVar5,(TemplateDictionary **)&it);
        std::__cxx11::string::~string((string *)local_88);
        p_Var9 = (_Base_ptr)&p_Var9->_M_parent;
      }
      small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
      ::iterator::operator++(&it_1);
      pSVar4 = this->section_dict_;
      uVar7 = pSVar4->size_;
    }
  }
  if (this->include_dict_ != (IncludeDict *)0x0) {
    LazilyCreateDict<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>>
              (this_01,&this_01->include_dict_);
    pIVar6 = this->include_dict_;
    uVar7 = pIVar6->size_;
    it_1.hash_iter_._M_node = (_Base_ptr)0x0;
    if ((int)uVar7 < 0) {
      it_1.hash_iter_._M_node = *(_Base_ptr *)((long)&pIVar6->field_2 + 0x20);
      it_1.array_iter_ =
           (ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
            *)0x0;
    }
    else {
      it_1.array_iter_ =
           (ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
            *)&pIVar6->field_2;
    }
    while( true ) {
      local_68.second.ptr_ = (char *)((long)&pIVar6->field_2 + 0x10);
      local_68.first = (long)&pIVar6->field_2 + (ulong)uVar7 * 0x10;
      if ((int)uVar7 < 0) {
        local_68.first = 0;
      }
      else {
        local_68.second.ptr_ = (char *)0x0;
      }
      bVar1 = small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
              ::iterator::operator!=(&it_1,(iterator *)&local_68);
      if (!bVar1) break;
      pvVar5 = (vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
                *)CreateDictVector(this_01);
      p_Var8 = it_1.hash_iter_._M_node + 1;
      if (it_1.array_iter_ !=
          (ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
           *)0x0) {
        p_Var8 = (_Base_ptr)it_1.array_iter_;
      }
      local_88._0_8_ = *(undefined8 *)p_Var8;
      local_88._8_8_ = pvVar5;
      small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
      ::insert((pair<ctemplate::small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>::iterator,_bool>
                *)&local_68,this_01->include_dict_,(value_type *)local_88);
      p_Var8 = it_1.hash_iter_._M_node + 1;
      if (it_1.array_iter_ !=
          (ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
           *)0x0) {
        p_Var8 = (_Base_ptr)it_1.array_iter_;
      }
      p_Var9 = p_Var8->_M_parent->_M_parent;
      while( true ) {
        p_Var8 = it_1.hash_iter_._M_node + 1;
        if (it_1.array_iter_ !=
            (ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
             *)0x0) {
          p_Var8 = (_Base_ptr)it_1.array_iter_;
        }
        if (p_Var9 == p_Var8->_M_parent->_M_left) break;
        pTVar3 = *(TemplateDictionary **)p_Var9;
        name_abi_cxx11_((string *)local_88,pTVar3);
        local_68.first = local_88._0_8_;
        local_68.second.ptr_ = (char *)local_88._8_8_;
        local_68.second.length_ = local_68.second.length_ & 0xffffffffffffff00;
        local_68.second._16_8_ = 0;
        it.array_iter_ =
             (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
             InternalMakeCopy(pTVar3,(TemplateString *)&local_68,this_01->arena_,
                              (TemplateDictionary *)0x0,this_01->template_global_dict_owner_);
        std::
        vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
        ::emplace_back<ctemplate::TemplateDictionary*>(pvVar5,(TemplateDictionary **)&it);
        std::__cxx11::string::~string((string *)local_88);
        p_Var9 = (_Base_ptr)&p_Var9->_M_parent;
      }
      small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
      ::iterator::operator++(&it_1);
      pIVar6 = this->include_dict_;
      uVar7 = pIVar6->size_;
    }
  }
  TemplateString::TemplateString((TemplateString *)local_88,this->filename_);
  Memdup((TemplateString *)&local_68,this_01,(TemplateString *)local_88);
  this_01->filename_ = (char *)local_68.first;
  return this_01;
}

Assistant:

TemplateDictionary* TemplateDictionary::InternalMakeCopy(
    const TemplateString& name_of_copy,
    UnsafeArena* arena,
    TemplateDictionary* parent_dict,
    TemplateDictionary* template_global_dict_owner) {

  TemplateDictionary* newdict;
  if (template_global_dict_owner_ == this) {
    // We're a root-level template.  We want the copy to be just like
    // us, and have its own template_global_dict_, that it owns.
    // We use the normal global new, since newdict will be returned
    // to the user.
    newdict = new TemplateDictionary(name_of_copy, arena);
  } else {                          // recursive calls use private contructor
    // We're not a root-level template, so we want the copy to refer to the
    // same template_global_dict_ owner that we do.
    // Note: we always use our own arena, even when we have a parent
    //       (though we have the same arena as our parent when we have one).
    assert(arena);
    assert(parent_dict ? arena == parent_dict->arena_ : true);
    newdict = CreateTemplateSubdict(name_of_copy, arena,
                                    parent_dict, template_global_dict_owner);
  }

  // Copy the variable dictionary
  if (variable_dict_) {
    newdict->LazilyCreateDict(&newdict->variable_dict_);
    for (VariableDict::const_iterator it = variable_dict_->begin();
         it != variable_dict_->end(); ++it) {
      newdict->variable_dict_->insert(make_pair(it->first,
                                                newdict->Memdup(it->second)));
    }
  }
  // ...and the template-global-dict, if we have one (only root-level tpls do)
  if (template_global_dict_) {
    newdict->template_global_dict_ = template_global_dict_->InternalMakeCopy(
        template_global_dict_->name(), newdict->arena_, newdict,
        newdict->template_global_dict_owner_);
  }
  // Copy the section dictionary
  if (section_dict_) {
    newdict->LazilyCreateDict(&newdict->section_dict_);
    for (SectionDict::iterator it = section_dict_->begin();
         it != section_dict_->end(); ++it) {
      DictVector* dicts = newdict->CreateDictVector();
      newdict->section_dict_->insert(make_pair(it->first, dicts));
      for (DictVector::iterator it2 = it->second->begin();
           it2 != it->second->end(); ++it2) {
        TemplateDictionary* subdict = *it2;
        // In this case, we pass in newdict as the parent of our new dict.
        dicts->push_back(subdict->InternalMakeCopy(
                             subdict->name(), newdict->arena_,
                             newdict, newdict->template_global_dict_owner_));
      }
    }
  }
  // Copy the includes-dictionary
  if (include_dict_) {
    newdict->LazilyCreateDict(&newdict->include_dict_);
    for (IncludeDict::iterator it = include_dict_->begin();
         it != include_dict_->end();  ++it) {
      DictVector* dicts = newdict->CreateDictVector();
      newdict->include_dict_->insert(make_pair(it->first, dicts));
      for (DictVector::iterator it2 = it->second->begin();
           it2 != it->second->end(); ++it2) {
        TemplateDictionary* subdict = *it2;
        // In this case, we pass in NULL as the parent of our new dict:
        // parents are not inherited across include-dictionaries.
        dicts->push_back(subdict->InternalMakeCopy(
                             subdict->name(), newdict->arena_,
                             NULL, newdict->template_global_dict_owner_));
      }
    }
  }

  // Finally, copy everything else not set properly by the constructor
  newdict->filename_ = newdict->Memdup(filename_).ptr_;

  return newdict;
}